

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfa.cc
# Opt level: O0

bool __thiscall
re2::Prog::SearchNFA
          (Prog *this,StringPiece *text,StringPiece *context,Anchor anchor,MatchKind kind,
          StringPiece *match,int nmatch)

{
  bool bVar1;
  iterator pcVar2;
  iterator pcVar3;
  undefined1 local_e8 [8];
  StringPiece sp;
  NFA nfa;
  StringPiece *match_local;
  MatchKind kind_local;
  Anchor anchor_local;
  StringPiece *context_local;
  StringPiece *text_local;
  Prog *this_local;
  
  NFA::NFA((NFA *)&sp.length_,this);
  StringPiece::StringPiece((StringPiece *)local_e8);
  nfa.free_threads_ = (Thread *)match;
  match_local._4_4_ = anchor;
  if ((kind == kFullMatch) && (match_local._4_4_ = kAnchored, nmatch == 0)) {
    nfa.free_threads_ = (Thread *)local_e8;
    nmatch = 1;
  }
  bVar1 = NFA::Search((NFA *)&sp.length_,text,context,match_local._4_4_ == kAnchored,
                      kind != kFirstMatch,(StringPiece *)nfa.free_threads_,nmatch);
  if (bVar1) {
    if (kind == kFullMatch) {
      pcVar2 = StringPiece::end((StringPiece *)nfa.free_threads_);
      pcVar3 = StringPiece::end(text);
      if (pcVar2 != pcVar3) {
        this_local._7_1_ = false;
        goto LAB_00170ff8;
      }
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
LAB_00170ff8:
  NFA::~NFA((NFA *)&sp.length_);
  return this_local._7_1_;
}

Assistant:

bool
Prog::SearchNFA(const StringPiece& text, const StringPiece& context,
                Anchor anchor, MatchKind kind,
                StringPiece* match, int nmatch) {
  if (NFA::Debug)
    Dump();

  NFA nfa(this);
  StringPiece sp;
  if (kind == kFullMatch) {
    anchor = kAnchored;
    if (nmatch == 0) {
      match = &sp;
      nmatch = 1;
    }
  }
  if (!nfa.Search(text, context, anchor == kAnchored, kind != kFirstMatch, match, nmatch))
    return false;
  if (kind == kFullMatch && match[0].end() != text.end())
    return false;
  return true;
}